

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::OneD::DataBarExpandedReader::decodePattern
          (Barcode *__return_storage_ptr__,DataBarExpandedReader *this,int rowNumber,
          PatternView *view,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  int *__k;
  long lVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ushort uVar6;
  ushort uVar7;
  pointer pPVar8;
  Character CVar9;
  Character CVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  pointer puVar17;
  pointer puVar18;
  Pair *pPVar19;
  pointer puVar20;
  bool bVar21;
  bool bVar22;
  DecodingState *pDVar23;
  Character CVar24;
  vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>> *this_00;
  __normal_iterator<ZXing::OneD::DataBar::Pair_*,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>
  _Var25;
  mapped_type *pmVar26;
  uint uVar27;
  BitArray *extraout_RDX;
  BitArray *extraout_RDX_00;
  BitArray *extraout_RDX_01;
  BitArray *_bits;
  Pair *pPVar28;
  Pair *pair;
  Iterator puVar29;
  Character CVar30;
  pointer pPVar31;
  Barcode *pBVar32;
  int iVar33;
  Character __position;
  iterator iVar34;
  Pair *__src;
  uint uVar35;
  const_iterator __end2;
  Iterator puVar36;
  pointer __old_p;
  Pairs pairs;
  BitArray res;
  string txt;
  Pairs local_208;
  map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
  *local_1e8;
  Barcode *local_1e0;
  Content local_1d8;
  DetectorResult local_198;
  DecoderResult local_158;
  ByteArray local_88;
  string local_70;
  Position local_50;
  
  pDVar23 = (state->_M_t).
            super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
            ._M_t.
            super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
            .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl;
  local_1e0 = __return_storage_ptr__;
  if (pDVar23 == (DecodingState *)0x0) {
    pDVar23 = (DecodingState *)operator_new(0x38);
    pDVar23->_vptr_DecodingState = (_func_int **)&PTR__DBERState_001f65b0;
    *(undefined4 *)&pDVar23[2]._vptr_DecodingState = 0;
    pDVar23[3]._vptr_DecodingState = (_func_int **)0x0;
    pDVar23[4]._vptr_DecodingState = (_func_int **)(pDVar23 + 2);
    pDVar23[5]._vptr_DecodingState = (_func_int **)(pDVar23 + 2);
    pDVar23[6]._vptr_DecodingState = (_func_int **)0x0;
    (state->_M_t).
    super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ._M_t.
    super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl = pDVar23;
  }
  local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xffffffff;
  local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xffffffff;
  local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xffffffff00000000;
  local_158._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_158._content.encodings.
                         super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  local_158._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_158._content.encodings.
                         super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
  view->_size = 0xf;
  puVar36 = view->_data;
  if (puVar36 != (Iterator)0x0) {
    local_1e8 = (map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                 *)(pDVar23 + 1);
    bVar21 = false;
    do {
      puVar29 = puVar36 + 1;
      view->_data = puVar29;
      if (view->_end < puVar36 + (long)view->_size + 1) break;
      uVar6 = puVar36[0xd];
      iVar33 = (uint)puVar36[10] + (uint)puVar36[0xb];
      uVar27 = (uint)puVar36[0xc] + (uint)uVar6;
      bVar22 = bVar21;
      if (((((uVar27 * 9 < iVar33 * 2 + 5U) &&
            (iVar33 = iVar33 * 2 + -5,
            SBORROW4(iVar33,uVar27 * 0xd) != (int)(iVar33 + uVar27 * -0xd) < 0)) &&
           ((uint)puVar36[9] < (uint)uVar6 * 4 + 2)) &&
          ((uVar27 < (uint)puVar36[9] << 2 && ((uint)uVar6 + (uint)uVar6 * 2 < (uint)puVar36[0xb])))
          ) && (bVar21 = IsCharacterPair(view), bVar21)) {
        ReadPair((Pair *)&local_198,view,Right);
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_198._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        puVar20 = local_158._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        local_158._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)local_198._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        local_158._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_158._content.encodings.
                               super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].
                               x);
        CVar30.value = local_198._bits._width;
        CVar30.checksum = local_198._bits._height;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_198._bits._0_8_;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_198._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)local_198._bits._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar20;
        if ((uint)local_158._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != 0) {
          bVar21 = (uint)local_158._content.bytes.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage == 1;
          CVar9 = CVar30;
          if (bVar21) {
            puVar29 = view->_data;
            uVar6 = puVar29[0xb];
            if (((int)(uint)puVar29[-1] <= (int)(((uint)uVar6 + (uint)uVar6 * 2 >> 2) - 2)) ||
               (CVar9 = (Character)
                        local_158._content.bytes.
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
               (uint)uVar6 + (uint)(uVar6 >> 2) + 2 <= (uint)puVar29[-1])) {
              local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)CVar30;
              bVar22 = true;
              goto LAB_00160acd;
            }
          }
          goto LAB_00160bb2;
        }
        puVar29 = view->_data;
        bVar21 = false;
        bVar22 = false;
        if (puVar29 != (Iterator)0x0) goto LAB_00160acd;
        puVar36 = (Iterator)0x0;
      }
      else {
LAB_00160acd:
        bVar21 = bVar22;
        puVar36 = puVar29 + 1;
        view->_data = puVar36;
        if (puVar29 + (long)view->_size + 1 <= view->_end) {
          uVar6 = puVar29[9];
          iVar33 = (uint)puVar29[0xc] + (uint)puVar29[0xb];
          uVar27 = (uint)puVar29[10] + (uint)uVar6;
          if ((((uVar27 * 9 < iVar33 * 2 + 5U) &&
               (iVar33 = iVar33 * 2 + -5,
               SBORROW4(iVar33,uVar27 * 0xd) != (int)(iVar33 + uVar27 * -0xd) < 0)) &&
              ((uint)puVar29[0xd] < (uint)uVar6 * 4 + 2)) &&
             (((uVar27 < (uint)puVar29[0xd] << 2 &&
               ((uint)uVar6 + (uint)uVar6 * 2 < (uint)puVar29[0xb])) &&
              (bVar22 = IsCharacterPair(view), bVar22)))) {
            ReadPair((Pair *)&local_198,view,Left);
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_198._bits._bits.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar20 = local_158._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            local_158._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)local_198._bits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
            local_158._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(local_158._content.encodings.
                                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems
                                   [0].x);
            CVar10.value = local_198._bits._width;
            CVar10.checksum = local_198._bits._height;
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_198._bits._0_8_;
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_198._bits._bits.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (uint)local_198._bits._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            bVar21 = (uint)local_158._content.bytes.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage != 0;
            CVar9 = (Character)
                    local_158._content.bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = puVar20;
            if (bVar21) goto LAB_00160bb2;
            puVar36 = view->_data;
            bVar21 = false;
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CVar10;
          }
        }
      }
    } while (puVar36 != (Iterator)0x0);
    CVar9 = (Character)
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (bVar21) {
LAB_00160bb2:
      local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CVar9;
      CVar24.value = 0;
      CVar24.checksum = 0;
      __position.value = 0;
      __position.checksum = 0;
      CVar9 = (Character)
              local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
      CVar30 = (Character)
               local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      while( true ) {
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)CVar30;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CVar9;
        local_158._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(rowNumber,
                               local_158._content.encodings.
                               super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_);
        if (__position == CVar24) {
          std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>::
          _M_realloc_insert<ZXing::OneD::DataBar::Pair_const&>
                    ((vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>
                      *)&local_1d8,(iterator)__position,(Pair *)&local_158);
        }
        else {
          *(undefined4 *)((long)__position + 0x20) =
               local_158._content.encodings.
               super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
               ._M_impl.super__Vector_impl_data._M_finish._0_4_;
          *(pointer *)((long)__position + 0x10) =
               local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          *(pointer *)((long)__position + 0x18) =
               local_158._content.encodings.
               super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
               ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)__position =
               local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)((long)__position + 8) =
               local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)((long)__position + 0x24);
        }
        bVar21 = (int)local_158._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish == -1;
        puVar20 = local_158._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        if (((bVar21) || (puVar36 = view->_data, puVar36 == (Iterator)0x0)) ||
           (view->_data = puVar36 + 0x15, view->_end < puVar36 + (long)view->_size + 0x15)) break;
        ReadPair((Pair *)&local_198,view,
                 (int)~(uint)local_158._content.bytes.
                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage >> 0x1f | Right);
        CVar9.value = local_198._bits._width;
        CVar9.checksum = local_198._bits._height;
        local_158._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)local_198._bits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_198._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        puVar20 = local_158._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        local_158._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_158._content.encodings.
                               super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].
                               x);
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_198._bits._0_8_;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_198._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
        puVar17 = local_158._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)local_198._bits._bits.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar17;
        if ((uint)local_158._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == 0) break;
        local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             (int)local_198._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar21 = (int)local_158._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish == -1;
        CVar24 = (Character)
                 local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        __position = (Character)
                     local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        CVar30 = (Character)
                 local_198._bits._bits.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (bVar21) {
          uVar6 = *(ushort *)
                   ((long)view->_data +
                   (ulong)(~(uint)local_158._content.bytes.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage >> 0x1d &
                           0xfffffff6 | 0x12));
          uVar7 = view->_data[0xd];
          if (((int)(uint)uVar6 <= (int)(((uint)uVar7 + (uint)uVar7 * 2 >> 2) - 2)) ||
             ((uint)uVar7 + (uint)(uVar7 >> 2) + 2 <= (uint)uVar6)) break;
        }
      }
      local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar20;
      puVar18 = local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      puVar17 = local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar20 = local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      CVar30 = (Character)
               local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if ((Character)
            local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (Character)0x0) {
          operator_delete(local_1d8.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1d8.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d8.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        do {
          this_00 = (vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>> *
                    )std::
                     map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                     ::operator[](local_1e8,(key_type *)((long)CVar30 + 0x10));
          _Var25 = std::
                   __find_if<__gnu_cxx::__normal_iterator<ZXing::OneD::DataBar::Pair*,std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::OneD::DataBar::Pair_const>>
                             (*(undefined8 *)this_00,*(undefined8 *)(this_00 + 8),CVar30);
          iVar34._M_current = *(Pair **)(this_00 + 8);
          if (_Var25._M_current == iVar34._M_current) {
            if (_Var25._M_current == *(Pair **)(this_00 + 0x10)) {
              std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>::
              _M_realloc_insert<ZXing::OneD::DataBar::Pair_const&>(this_00,iVar34,(Pair *)CVar30);
            }
            else {
              (iVar34._M_current)->count = *(int *)((long)CVar30 + 0x20);
              CVar9 = *(Character *)CVar30;
              CVar10 = *(Character *)((long)CVar30 + 8);
              uVar11 = *(undefined8 *)((long)CVar30 + 0x10);
              uVar12 = *(undefined8 *)((long)CVar30 + 0x18);
              (iVar34._M_current)->finder = (int)uVar11;
              (iVar34._M_current)->xStart = (int)((ulong)uVar11 >> 0x20);
              (iVar34._M_current)->xStop = (int)uVar12;
              (iVar34._M_current)->y = (int)((ulong)uVar12 >> 0x20);
              (iVar34._M_current)->left = CVar9;
              (iVar34._M_current)->right = CVar10;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x24;
            }
          }
          else {
            (_Var25._M_current)->count = (_Var25._M_current)->count + 1;
            if (_Var25._M_current != *(Pair **)this_00) {
              do {
                if ((_Var25._M_current)->count <= _Var25._M_current[-1].count) break;
                iVar33 = _Var25._M_current[-1].count;
                local_158._content.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)CONCAT44(local_158._content.encodings.
                                       super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar33);
                local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = *(pointer *)&_Var25._M_current[-1].left;
                local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = *(pointer *)&_Var25._M_current[-1].right;
                local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = _Var25._M_current[-1].finder;
                local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = _Var25._M_current[-1].xStart;
                local_158._content.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&_Var25._M_current[-1].xStop
                ;
                CVar9 = (_Var25._M_current)->right;
                iVar13 = (_Var25._M_current)->finder;
                iVar14 = (_Var25._M_current)->xStart;
                iVar15 = (_Var25._M_current)->xStop;
                iVar16 = (_Var25._M_current)->y;
                _Var25._M_current[-1].left = (_Var25._M_current)->left;
                _Var25._M_current[-1].right = CVar9;
                _Var25._M_current[-1].finder = iVar13;
                _Var25._M_current[-1].xStart = iVar14;
                _Var25._M_current[-1].xStop = iVar15;
                _Var25._M_current[-1].y = iVar16;
                _Var25._M_current[-1].count = (_Var25._M_current)->count;
                (_Var25._M_current)->left =
                     (Character)
                     local_158._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
                (_Var25._M_current)->right =
                     (Character)
                     local_158._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                (_Var25._M_current)->finder =
                     (uint)local_158._content.bytes.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
                (_Var25._M_current)->xStart =
                     local_158._content.bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
                *(pointer *)&(_Var25._M_current)->xStop =
                     local_158._content.encodings.
                     super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                (_Var25._M_current)->count = iVar33;
                _Var25._M_current = _Var25._M_current + -1;
              } while (_Var25._M_current != *(Pair **)this_00);
            }
          }
          CVar30 = (Character)((long)CVar30 + 0x24);
        } while (CVar30 != (Character)puVar17);
        if ((Character)puVar20 != (Character)0x0) {
          operator_delete(puVar20,(long)puVar18 - (long)puVar20);
        }
        if (puVar20 != puVar17) {
          local_208.
          super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
          ._M_impl.super__Vector_impl_data._M_start = (Pair *)0x0;
          local_208.
          super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
          ._M_impl.super__Vector_impl_data._M_finish = (Pair *)0x0;
          local_208.
          super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (Pair *)0x0;
          pmVar26 = std::
                    map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                    ::operator[](local_1e8,&FINDER_A);
          pPVar31 = (pmVar26->
                    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pPVar8 = (pmVar26->
                   super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pPVar31 != pPVar8) {
            iVar34._M_current = (Pair *)0x0;
            do {
              iVar33 = (pPVar31->left).value;
              iVar13 = iVar33 >> 0x1f;
              iVar33 = iVar33 / 0xd3 + iVar13;
              iVar33 = ((iVar33 - iVar13) - ((iVar33 - iVar13) + 5 >> 0x1f)) + 5 >> 1;
              if (iVar33 <= *(int *)&pDVar23[6]._vptr_DecodingState) {
                if (iVar34._M_current ==
                    local_208.
                    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>
                  ::_M_realloc_insert<ZXing::OneD::DataBar::Pair_const&>
                            ((vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>
                              *)&local_208,iVar34,pPVar31);
                }
                else {
                  (iVar34._M_current)->count = pPVar31->count;
                  CVar30 = pPVar31->left;
                  CVar9 = pPVar31->right;
                  iVar13 = pPVar31->xStart;
                  iVar14 = pPVar31->xStop;
                  iVar15 = pPVar31->y;
                  (iVar34._M_current)->finder = pPVar31->finder;
                  (iVar34._M_current)->xStart = iVar13;
                  (iVar34._M_current)->xStop = iVar14;
                  (iVar34._M_current)->y = iVar15;
                  (iVar34._M_current)->left = CVar30;
                  (iVar34._M_current)->right = CVar9;
                  local_208.
                  super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar34._M_current + 1;
                }
                lVar1 = (long)(iVar33 + -2) * 0x18;
                bVar21 = FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                   (local_1e8,
                                    (int *)(*(long *)(FINDER_PATTERN_SEQUENCES + lVar1) + 4),
                                    (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )*(int **)(FINDER_PATTERN_SEQUENCES + lVar1 + 8),&local_208);
                if (bVar21) break;
                iVar34._M_current =
                     local_208.
                     super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
                local_208.
                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar34._M_current;
              }
              pPVar31 = pPVar31 + 1;
            } while (pPVar31 != pPVar8);
          }
          pBVar32 = local_1e0;
          if (local_208.
              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_208.
              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            memset(local_1e0,0,0xd8);
            Result::Result(pBVar32);
          }
          else {
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar27 = ((local_208.
                       super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                       ._M_impl.super__Vector_impl_data._M_start)->right).value;
            uVar35 = 0xb;
            do {
              local_198._bits._width._0_1_ = (uVar27 >> (uVar35 & 0x1f) & 1) != 0;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,
                         (uchar *)&local_198);
              bVar21 = uVar35 != 0;
              uVar35 = uVar35 - 1;
            } while (bVar21);
            _bits = extraout_RDX;
            if (local_208.
                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ._M_impl.super__Vector_impl_data._M_start + 1 !=
                local_208.
                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pPVar19 = local_208.
                        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1;
              pPVar31 = local_208.
                        super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                pPVar28 = pPVar19;
                uVar27 = pPVar31[1].left.value;
                uVar35 = 0xb;
                do {
                  local_198._bits._width._0_1_ = (uVar27 >> (uVar35 & 0x1f) & 1) != 0;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                  emplace_back<unsigned_char>
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,
                             (uchar *)&local_198);
                  bVar21 = uVar35 != 0;
                  uVar35 = uVar35 - 1;
                } while (bVar21);
                uVar27 = pPVar31[1].right.value;
                _bits = extraout_RDX_00;
                if (uVar27 != 0xffffffff) {
                  uVar35 = 0xb;
                  do {
                    local_198._bits._width._0_1_ = (uVar27 >> (uVar35 & 0x1f) & 1) != 0;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    emplace_back<unsigned_char>
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,
                               (uchar *)&local_198);
                    bVar21 = uVar35 != 0;
                    uVar35 = uVar35 - 1;
                    _bits = extraout_RDX_01;
                  } while (bVar21);
                }
                pPVar19 = pPVar28 + 1;
                pPVar31 = pPVar28;
              } while (pPVar19 !=
                       local_208.
                       super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            DataBar::DecodeExpandedBits_abi_cxx11_(&local_70,(DataBar *)&local_158,_bits);
            pBVar32 = local_1e0;
            if ((Character)
                local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (Character)0x0) {
              operator_delete(local_158._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_158._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_158._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            pPVar31 = local_208.
                      super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pPVar19 = local_208.
                      super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_70._M_string_length == 0) {
              memset(pBVar32,0,0xd8);
              Result::Result(pBVar32);
            }
            else {
              for (; pPVar19 != pPVar31; pPVar19 = pPVar19 + 1) {
                __k = &pPVar19->finder;
                pmVar26 = std::
                          map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                          ::operator[](local_1e8,__k);
                _Var25 = std::
                         __find_if<__gnu_cxx::__normal_iterator<ZXing::OneD::DataBar::Pair*,std::vector<ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::OneD::DataBar::Pair_const>>
                                   ((pmVar26->
                                    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                                    (pmVar26->
                                    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                                    )._M_impl.super__Vector_impl_data._M_finish,pPVar19);
                pmVar26 = std::
                          map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                          ::operator[](local_1e8,__k);
                if (_Var25._M_current !=
                    (pmVar26->
                    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
                  piVar2 = &(_Var25._M_current)->count;
                  *piVar2 = *piVar2 + -1;
                  if (*piVar2 == 0) {
                    pmVar26 = std::
                              map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                              ::operator[](local_1e8,__k);
                    __src = _Var25._M_current + 1;
                    pPVar28 = (pmVar26->
                              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                              )._M_impl.super__Vector_impl_data._M_finish;
                    if (__src != pPVar28) {
                      memmove(_Var25._M_current,__src,(long)pPVar28 - (long)__src);
                      pPVar28 = (pmVar26->
                                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
                    }
                    (pmVar26->
                    super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                    )._M_impl.super__Vector_impl_data._M_finish = pPVar28 + -1;
                  }
                }
              }
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_70._M_dataplus._M_p,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_70._M_dataplus._M_p + local_70._M_string_length),
                         (allocator_type *)&local_198);
              Content::Content(&local_1d8,&local_88,(SymbologyIdentifier)0x1003065);
              paVar3 = &local_158._ecLevel.field_2;
              local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_158._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_158._content.encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_1d8.encodings.
                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_158._content.encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_1d8.encodings.
                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_158._content.encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_1d8.encodings.
                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1d8.encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1d8.encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1d8.encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_158._content.symbology = local_1d8.symbology;
              local_158._content.defaultCharset = local_1d8.defaultCharset;
              local_158._content.hasECI = local_1d8.hasECI;
              local_158._ecLevel._M_string_length = 0;
              local_158._ecLevel.field_2._M_local_buf[0] = '\0';
              local_158._lineCount = 0;
              local_158._versionNumber = 0;
              local_158._structuredAppend.index = -1;
              local_158._structuredAppend.count = -1;
              paVar4 = &local_158._structuredAppend.id.field_2;
              local_158._structuredAppend.id._M_string_length = 0;
              local_158._structuredAppend.id.field_2._M_local_buf[0] = '\0';
              local_158._isMirrored = false;
              local_158._readerInit = false;
              paVar5 = &local_158._error._msg.field_2;
              local_158._error._msg._M_string_length = 0;
              local_158._error._msg.field_2._M_local_buf[0] = '\0';
              local_158._error._file = (char *)0x0;
              local_158._error._line = -1;
              local_158._error._type = None;
              local_158._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              local_158._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_158._ecLevel._M_dataplus._M_p = (pointer)paVar3;
              local_158._structuredAppend.id._M_dataplus._M_p = (pointer)paVar4;
              local_158._error._msg._M_dataplus._M_p = (pointer)paVar5;
              iVar33 = DataBar::EstimateLineCount
                                 (local_208.
                                  super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  local_208.
                                  super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1);
              local_158._lineCount = iVar33;
              DataBar::EstimatePosition
                        (&local_50,
                         local_208.
                         super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_208.
                         super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
              local_198._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_198._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_198._bits._width = 0;
              local_198._bits._height = 0;
              local_198._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0] =
                   local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
              local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
                   local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
              local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
                   local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[2];
              local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
                   local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
              Result::Result(local_1e0,&local_158,&local_198,DataBarExpanded);
              if ((Character)
                  local_198._bits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (Character)0x0) {
                operator_delete(local_198._bits._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_198._bits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_198._bits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_158._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_158._extra.
                           super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._error._msg._M_dataplus._M_p != paVar5) {
                operator_delete(local_158._error._msg._M_dataplus._M_p,
                                CONCAT71(local_158._error._msg.field_2._M_allocated_capacity._1_7_,
                                         local_158._error._msg.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._structuredAppend.id._M_dataplus._M_p != paVar4) {
                operator_delete(local_158._structuredAppend.id._M_dataplus._M_p,
                                CONCAT71(local_158._structuredAppend.id.field_2.
                                         _M_allocated_capacity._1_7_,
                                         local_158._structuredAppend.id.field_2._M_local_buf[0]) + 1
                               );
              }
              pBVar32 = local_1e0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._ecLevel._M_dataplus._M_p != paVar3) {
                operator_delete(local_158._ecLevel._M_dataplus._M_p,
                                CONCAT71(local_158._ecLevel.field_2._M_allocated_capacity._1_7_,
                                         local_158._ecLevel.field_2._M_local_buf[0]) + 1);
              }
              if (local_158._content.encodings.
                  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_158._content.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_158._content.encodings.
                                      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_158._content.encodings.
                                      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((Character)
                  local_158._content.bytes.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (Character)0x0) {
                operator_delete(local_158._content.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_158._content.bytes.
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_158._content.bytes.
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1d8.encodings.
                  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1d8.encodings.
                                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_1d8.encodings.
                                      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1d8.encodings.
                                      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((Character)
                  local_1d8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (Character)0x0) {
                operator_delete(local_1d8.bytes.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1d8.bytes.
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1d8.bytes.
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_88.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_88.
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_88.
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_208.
              super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
              ._M_impl.super__Vector_impl_data._M_start == (Pair *)0x0) {
            return pBVar32;
          }
          operator_delete(local_208.
                          super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_208.
                                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_208.
                                super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          return pBVar32;
        }
      }
      goto LAB_00160cf3;
    }
  }
  view->_base = (Iterator)0x0;
  view->_end = (Iterator)0x0;
  view->_data = (Iterator)0x0;
  *(undefined8 *)&view->_size = 0;
LAB_00160cf3:
  pBVar32 = local_1e0;
  memset(local_1e0,0,0xd8);
  Result::Result(pBVar32);
  return pBVar32;
}

Assistant:

Barcode DataBarExpandedReader::decodePattern(int rowNumber, PatternView& view, std::unique_ptr<RowReader::DecodingState>& state) const
{
#if 0 // non-stacked version
	auto pairs = ReadRowOfPairs<false>(view, rowNumber);

	if (pairs.empty() || !ChecksumIsValid(pairs))
		return {};
#else
	if (!state)
		state.reset(new DBERState);
	auto& allPairs = static_cast<DBERState*>(state.get())->allPairs;

	// Stacked codes can be laid out in a number of ways. The following rules apply:
	//  * the first row starts with FINDER_A in left-to-right (l2r) layout
	//  * pairs in l2r layout start with a space, r2l ones with a bar
	//  * l2r and r2l finders always alternate
	//  * rows may contain any number of pairs
	//  * even rows may be reversed
	//  * a l2r pair that starts with a bar is actually a r2l pair on a reversed line
	//  * the last pair of the symbol may be missing the right character
	//
	// 3 examples: (r == l2r, l == r2l, R/L == r/l but reversed)
	//    r l r l    |    r l     |     r l r
	//    L R L R    |    r       |     l

	if (!Insert(allPairs, ReadRowOfPairs<true>(view, rowNumber)))
		return {};

	auto pairs = FindValidSequence(allPairs);
	if (pairs.empty())
		return {};
#endif

	auto txt = DecodeExpandedBits(BuildBitArray(pairs));
	if (txt.empty())
		return {};

	RemovePairs(allPairs, pairs);

	// TODO: EstimatePosition misses part of the symbol in the stacked case where the last row contains less pairs than
	// the first
	// Symbology identifier: ISO/IEC 24724:2011 Section 9 and GS1 General Specifications 5.1.3 Figure 5.1.3-2
	return {DecoderResult(Content(ByteArray(txt), {'e', '0', 0, AIFlag::GS1}))
				.setLineCount(EstimateLineCount(pairs.front(), pairs.back())),
			{{}, EstimatePosition(pairs.front(), pairs.back())}, BarcodeFormat::DataBarExpanded};
}